

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JasmineTest.cpp
# Opt level: O2

int openInDefaultBrowser(string_view port,string_view file)

{
  int iVar1;
  _If_sv<std::basic_string_view<char>,_basic_string<char>_&> __lhs;
  _If_sv<std::basic_string_view<char>,_basic_string<char>_&> __rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> url;
  string command;
  allocator<char> local_aa;
  allocator<char> local_a9;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68 [32];
  string local_48 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"xdg-open ",(allocator<char> *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>(local_48,"http://localhost:",&local_a9);
  __lhs = std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                    (local_48,&local_98);
  std::__cxx11::string::string<std::allocator<char>>(local_68,"/",&local_aa);
  __rhs = std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                    (local_68,&local_a8);
  std::operator+(&local_88,__lhs,__rhs);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  pbVar2 = webfront::http::std::__cxx11::
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_28,&local_88);
  iVar1 = system((pbVar2->_M_dataplus)._M_p);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_28);
  return iVar1;
}

Assistant:

auto openInDefaultBrowser(std::string_view port, std::string_view file) {
#ifdef _WIN32
    auto command = std::string("start ");
#elif __linux__
    auto command = std::string("xdg-open ");
#elif __APPLE__
    auto command = std::string("open ");
#endif

    auto url = std::string("http://localhost:").append(port) + std::string("/").append(file);
    return ::system(command.append(url).c_str());
}